

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O2

QDateTimeEditPrivate * __thiscall
QDateTimeEditPrivate::stepBy(QDateTimeEditPrivate *this,int sectionIndex,int steps,bool test)

{
  QDateTime *pQVar1;
  uint uVar2;
  long lVar3;
  long *plVar4;
  undefined1 *puVar5;
  char cVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  uint *puVar13;
  long lVar14;
  int iVar15;
  undefined7 in_register_00000009;
  QDateTime *pQVar16;
  undefined4 in_register_00000034;
  long *plVar17;
  int in_R8D;
  long in_FS_OFFSET;
  char local_bc;
  QDateTime local_b8 [8];
  QDateTime maximumDateTime;
  QDateTime minimumDateTime;
  int pos;
  QArrayDataPointer<char16_t> local_98;
  QDateTime v;
  anon_union_24_3_e3d07ef4_for_data local_78;
  QDateTime t;
  
  plVar17 = (long *)CONCAT44(in_register_00000034,sectionIndex);
  iVar15 = (int)CONCAT71(in_register_00000009,test);
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  plVar4 = (long *)plVar17[1];
  _v = &DAT_aaaaaaaaaaaaaaaa;
  ::QVariant::toDateTime();
  local_98.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_98.d._0_4_ = 0xaaaaaaaa;
  local_98.d._4_4_ = 0xaaaaaaaa;
  local_98.ptr._0_4_ = 0xaaaaaaaa;
  local_98.ptr._4_4_ = 0xaaaaaaaa;
  (**(code **)(*plVar17 + 0x110))(&local_98,plVar17);
  pos = QLineEdit::cursorPosition((QLineEdit *)plVar17[0x6f]);
  pQVar1 = (QDateTime *)(plVar17 + 0x7b);
  iVar11 = (int)pQVar1;
  puVar13 = (uint *)QDateTimeParser::sectionNode(iVar11);
  uVar2 = *puVar13;
  if (((in_R8D == 0) && ((*(byte *)(plVar17 + 0x7a) & 1) != 0)) &&
     (iVar9 = (**(code **)(*plVar4 + 0x1a0))(plVar4,&local_98,&pos), iVar9 == 2)) {
    (**(code **)(*plVar4 + 0x1d0))(&t,plVar4,&local_98);
    puVar5 = _v;
    _v = _t;
    _t = puVar5;
    QDateTime::~QDateTime(&t);
  }
  iVar9 = QDateTimeParser::getDigit(pQVar1,(int)&v);
  iVar10 = QDateTimeParser::absoluteMin(iVar11);
  ::QVariant::toDateTime();
  iVar11 = QDateTimeParser::absoluteMax(iVar11,(QDateTime *)(ulong)(uint)steps);
  QDateTime::~QDateTime(&t);
  if ((uVar2 & 0x3000) == 0) {
    iVar9 = iVar9 + iVar15;
    iVar12 = (iVar11 - iVar10) + 1;
    if (iVar9 < iVar10) {
      iVar9 = iVar12 + iVar9;
      if ((*(byte *)(plVar17 + 0x7a) & 4) == 0) {
        iVar9 = iVar10;
      }
    }
    else if ((iVar11 < iVar9) && (iVar9 = iVar9 - iVar12, (*(byte *)(plVar17 + 0x7a) & 4) == 0)) {
      iVar9 = iVar11;
    }
  }
  else {
    if ((*(byte *)(plVar17 + 0x7a) & 4) == 0) {
      (**(code **)(*plVar17 + 0x128))(&t);
      iVar11 = QLocale::firstDayOfWeek();
      QLocale::~QLocale((QLocale *)&t);
      iVar10 = iVar11 + -7;
      if (iVar11 <= iVar9) {
        iVar10 = iVar11;
      }
      iVar11 = (-(uint)(iVar9 < iVar11) | 6) + iVar11;
      if (iVar9 + iVar15 <= iVar11) {
        iVar11 = iVar9 + iVar15;
      }
      if (iVar11 < iVar10) {
        iVar11 = iVar10;
      }
    }
    else {
      iVar11 = iVar9 + iVar15;
    }
    iVar11 = iVar11 % 7;
    iVar9 = iVar11 + 7;
    if (0 < iVar11) {
      iVar9 = iVar11;
    }
  }
  _t = (undefined1 *)QDateTime::date();
  iVar11 = QDate::day(&t,plVar17[0x8d]);
  cVar6 = QDateTimeParser::setDigit(pQVar1,(int)&v,steps);
  if (((cVar6 != '\0') && (iVar10 = QDateTimeParser::getDigit(pQVar1,(int)&v), iVar15 < 0)) &&
     ((iVar10 != iVar9 && ((uVar2 & 0x30) != 0)))) {
    lVar14 = QDateTime::toMSecsSinceEpoch();
    QDateTime::timeRepresentation();
    QDateTime::fromMSecsSinceEpoch((longlong)&t,(QTimeZone *)(lVar14 + -3600000));
    puVar5 = _v;
    _v = _t;
    _t = puVar5;
    QDateTime::~QDateTime(&t);
    QTimeZone::~QTimeZone((QTimeZone *)&local_78.shared);
  }
  _minimumDateTime = &DAT_aaaaaaaaaaaaaaaa;
  ::QVariant::toDateTime();
  _maximumDateTime = &DAT_aaaaaaaaaaaaaaaa;
  ::QVariant::toDateTime();
  if ((uVar2 != 1 && (uVar2 & 0x3000) == 0) &&
     ((bVar7 = ::operator<(&v,&minimumDateTime), bVar7 ||
      (bVar7 = operator>(&v,&maximumDateTime), bVar7)))) {
    QDateTimeParser::getDigit(pQVar1,(int)&minimumDateTime);
    QDateTimeParser::getDigit(pQVar1,(int)&maximumDateTime);
    if ((*(byte *)(plVar17 + 0x7a) & 4) == 0) {
LAB_003c1983:
      QDateTimeParser::setDigit(pQVar1,(int)&v,steps);
    }
    else if (iVar15 < 1) {
      QDateTimeParser::setDigit(pQVar1,(int)&v,steps);
      if (((uVar2 >> 8 & 1) == 0) && ((*(byte *)((long)plVar17 + 0x471) & 0x3f) != 0)) {
        _t = (undefined1 *)QDateTime::date();
        iVar9 = QDate::daysInMonth(&t,plVar17[0x8d]);
        _t = (undefined1 *)QDateTime::date();
        iVar10 = QDate::day(&t,plVar17[0x8d]);
        if (iVar10 < iVar11) {
          local_78.shared = (PrivateShared *)QDateTime::date();
          iVar10 = QDate::day(&local_78,plVar17[0x8d]);
          if (iVar10 < iVar9) {
            local_78.shared = (PrivateShared *)QDateTime::date();
            QDate::day(&local_78,plVar17[0x8d]);
            QDateTime::addDays((longlong)&t);
            puVar5 = _v;
            _v = _t;
            _t = puVar5;
            QDateTime::~QDateTime(&t);
          }
        }
      }
      bVar7 = operator>(&v,&maximumDateTime);
      if (bVar7) {
        QDateTimeParser::setDigit(pQVar1,(int)&v,steps);
        bVar7 = operator>(&v,&maximumDateTime);
        if (bVar7) goto LAB_003c1983;
      }
    }
    else {
      QDateTimeParser::setDigit(pQVar1,(int)&v,steps);
      if (((uVar2 >> 8 & 1) == 0) && ((*(byte *)((long)plVar17 + 0x471) & 0x3f) != 0)) {
        _t = (undefined1 *)QDateTime::date();
        iVar9 = QDate::daysInMonth(&t,plVar17[0x8d]);
        _t = (undefined1 *)QDateTime::date();
        iVar10 = QDate::day(&t,plVar17[0x8d]);
        if (iVar10 < iVar11) {
          local_78.shared = (PrivateShared *)QDateTime::date();
          iVar10 = QDate::day(&local_78,plVar17[0x8d]);
          if (iVar10 < iVar9) {
            local_78.shared = (PrivateShared *)QDateTime::date();
            QDate::day(&local_78,plVar17[0x8d]);
            QDateTime::addDays((longlong)&t);
            puVar5 = _v;
            _v = _t;
            _t = puVar5;
            QDateTime::~QDateTime(&t);
          }
        }
      }
      bVar7 = ::operator<(&v,&minimumDateTime);
      if (bVar7) {
        QDateTimeParser::setDigit(pQVar1,(int)&v,steps);
        bVar7 = ::operator<(&v,&minimumDateTime);
        if (bVar7) goto LAB_003c1983;
      }
    }
  }
  local_bc = (char)in_R8D;
  if (local_bc == '\0') {
    _t = (undefined1 *)QDateTime::date();
    iVar9 = QDate::day(&t,plVar17[0x8d]);
    if ((iVar11 != iVar9) && ((uVar2 & 0x3100) == 0)) {
      iVar9 = *(int *)((long)plVar17 + 0x3ec);
      if (*(int *)((long)plVar17 + 0x3ec) < iVar11) {
        iVar9 = iVar11;
      }
      *(int *)((long)plVar17 + 0x3ec) = iVar9;
    }
  }
  bVar7 = ::operator<(&v,&minimumDateTime);
  if (bVar7) {
    if ((*(byte *)(plVar17 + 0x7a) & 4) != 0) {
      _t = &DAT_aaaaaaaaaaaaaaaa;
      QDateTime::QDateTime(&t,&v);
      QDateTimeParser::setDigit(pQVar1,(int)&t,steps);
      bVar7 = operator>=(&t,&minimumDateTime);
      bVar8 = operator<=(&t,&maximumDateTime);
      if ((bVar7) && (bVar8)) {
LAB_003c1d2e:
        QDateTime::operator=(&v,&t);
      }
      else {
        pQVar16 = &minimumDateTime;
        if (iVar15 < 0) {
          pQVar16 = &maximumDateTime;
        }
        QDateTimeParser::getDigit(pQVar1,(int)pQVar16);
        QDateTimeParser::setDigit(pQVar1,(int)&t,steps);
        bVar7 = operator>=(&t,&minimumDateTime);
        bVar8 = operator<=(&t,&maximumDateTime);
        if (bVar7) {
LAB_003c1d2a:
          if (bVar8 != false) goto LAB_003c1d2e;
        }
      }
LAB_003c1d40:
      QDateTime::~QDateTime(&t);
      goto LAB_003c1d52;
    }
  }
  else {
    bVar7 = operator>(&v,&maximumDateTime);
    if (!bVar7) goto LAB_003c1d52;
    if ((*(byte *)(plVar17 + 0x7a) & 4) != 0) {
      _t = &DAT_aaaaaaaaaaaaaaaa;
      QDateTime::QDateTime(&t,&v);
      QDateTimeParser::setDigit(pQVar1,(int)&t,steps);
      bVar7 = operator>=(&t,&minimumDateTime);
      bVar8 = operator<=(&t,&maximumDateTime);
      if ((!bVar7) || (!bVar8)) {
        pQVar16 = &maximumDateTime;
        if (0 < iVar15) {
          pQVar16 = &minimumDateTime;
        }
        QDateTimeParser::getDigit(pQVar1,(int)pQVar16);
        QDateTimeParser::setDigit(pQVar1,(int)&t,steps);
        bVar7 = operator>=(&t,&minimumDateTime);
        bVar8 = operator<=(&t,&maximumDateTime);
        if (bVar7) goto LAB_003c1d2a;
        goto LAB_003c1d40;
      }
      goto LAB_003c1d2e;
    }
  }
  ::QVariant::toDateTime();
  puVar5 = _v;
  _v = _t;
  _t = puVar5;
  QDateTime::~QDateTime(&t);
LAB_003c1d52:
  ::QVariant::QVariant((QVariant *)&local_78,&v);
  (**(code **)(*plVar17 + 0xb8))(&t,plVar17,&local_78,plVar17 + 0x54,iVar15);
  ::QVariant::toDateTime();
  QDateTime::toTimeZone((QTimeZone *)this);
  QDateTime::~QDateTime(local_b8);
  ::QVariant::~QVariant((QVariant *)&t);
  ::QVariant::~QVariant((QVariant *)&local_78);
  QDateTime::~QDateTime(&maximumDateTime);
  QDateTime::~QDateTime(&minimumDateTime);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
  QDateTime::~QDateTime(&v);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar3) {
    __stack_chk_fail();
  }
  return this;
}

Assistant:

QDateTime QDateTimeEditPrivate::stepBy(int sectionIndex, int steps, bool test) const
{
    Q_Q(const QDateTimeEdit);
    QDateTime v = value.toDateTime();
    QString str = displayText();
    int pos = edit->cursorPosition();
    const SectionNode sn = sectionNode(sectionIndex);

    // to make sure it behaves reasonably when typing something and then stepping in non-tracking mode
    if (!test && pendingEmit && q->validate(str, pos) == QValidator::Acceptable)
        v = q->dateTimeFromText(str);
    int val = getDigit(v, sectionIndex);

    const int min = absoluteMin(sectionIndex);
    const int max = absoluteMax(sectionIndex, value.toDateTime());

    if (sn.type & DayOfWeekSectionMask) {
        // Must take locale's first day of week into account when *not*
        // wrapping; min and max don't help us.
#ifndef QT_ALWAYS_WRAP_WEEKDAY // (documentation, not an actual define)
        if (!wrapping) {
            /* It's not clear this is ever really a desirable behavior.

               It refuses to step backwards from the first day of the week or
               forwards from the day before, only allowing day-of-week stepping
               from start to end of one week. That's strictly what non-wrapping
               behavior must surely mean, when put in locale-neutral terms.

               It is, however, likely that users would prefer the "more natural"
               behavior of cycling through the week.
            */
            const int first = int(locale().firstDayOfWeek()); // Mon = 1 through 7 = Sun
            val = qBound(val < first ? first - 7 : first,
                         val + steps,
                         val < first ? first - 1 : first + 6);
        } else
#endif
        {
            val += steps;
        }

        // Restore to range from 1 through 7:
        val = val % 7;
        if (val <= 0)
            val += 7;
    } else {
        val += steps;
        const int span = max - min + 1;
        if (val < min)
            val = wrapping ? val + span : min;
        else if (val > max)
            val = wrapping ? val - span : max;
    }

    const int oldDay = v.date().day(calendar);

    /*
        Stepping into a daylight saving time that doesn't exist (setDigit() is
        true when date and time are valid, even if the date-time returned
        isn't), so use the time that has the same distance from epoch.
    */
    if (setDigit(v, sectionIndex, val) && getDigit(v, sectionIndex) != val
        && sn.type & HourSectionMask && steps < 0) {
        // decreasing from e.g 3am to 2am would get us back to 3am, but we want 1am
        auto msecsSinceEpoch = v.toMSecsSinceEpoch() - 3600 * 1000;
        v = QDateTime::fromMSecsSinceEpoch(msecsSinceEpoch, v.timeRepresentation());
    }
    // if this sets year or month it will make
    // sure that days are lowered if needed.

    const QDateTime minimumDateTime = minimum.toDateTime();
    const QDateTime maximumDateTime = maximum.toDateTime();
    // changing one section should only modify that section, if possible
    if (sn.type != AmPmSection && !(sn.type & DayOfWeekSectionMask)
        && (v < minimumDateTime || v > maximumDateTime)) {
        const int localmin = getDigit(minimumDateTime, sectionIndex);
        const int localmax = getDigit(maximumDateTime, sectionIndex);

        if (wrapping) {
            // just because we hit the roof in one direction, it
            // doesn't mean that we hit the floor in the other
            if (steps > 0) {
                setDigit(v, sectionIndex, min);
                if (!(sn.type & DaySectionMask) && sections & DateSectionMask) {
                    const int daysInMonth = v.date().daysInMonth(calendar);
                    if (v.date().day(calendar) < oldDay && v.date().day(calendar) < daysInMonth) {
                        const int adds = qMin(oldDay, daysInMonth);
                        v = v.addDays(adds - v.date().day(calendar));
                    }
                }

                if (v < minimumDateTime) {
                    setDigit(v, sectionIndex, localmin);
                    if (v < minimumDateTime)
                        setDigit(v, sectionIndex, localmin + 1);
                }
            } else {
                setDigit(v, sectionIndex, max);
                if (!(sn.type & DaySectionMask) && sections & DateSectionMask) {
                    const int daysInMonth = v.date().daysInMonth(calendar);
                    if (v.date().day(calendar) < oldDay && v.date().day(calendar) < daysInMonth) {
                        const int adds = qMin(oldDay, daysInMonth);
                        v = v.addDays(adds - v.date().day(calendar));
                    }
                }

                if (v > maximumDateTime) {
                    setDigit(v, sectionIndex, localmax);
                    if (v > maximumDateTime)
                        setDigit(v, sectionIndex, localmax - 1);
                }
            }
        } else {
            setDigit(v, sectionIndex, (steps > 0 ? localmax : localmin));
        }
    }
    if (!test && oldDay != v.date().day(calendar) && !(sn.type & DaySectionMask)) {
        // this should not happen when called from stepEnabled
        cachedDay = qMax<int>(oldDay, cachedDay);
    }

    if (v < minimumDateTime) {
        if (wrapping) {
            QDateTime t = v;
            setDigit(t, sectionIndex, steps < 0 ? max : min);
            bool mincmp = (t >= minimumDateTime);
            bool maxcmp = (t <= maximumDateTime);
            if (!mincmp || !maxcmp) {
                setDigit(t, sectionIndex, getDigit(steps < 0
                                                   ? maximumDateTime
                                                   : minimumDateTime, sectionIndex));
                mincmp = (t >= minimumDateTime);
                maxcmp = (t <= maximumDateTime);
            }
            if (mincmp && maxcmp) {
                v = t;
            }
        } else {
            v = value.toDateTime();
        }
    } else if (v > maximumDateTime) {
        if (wrapping) {
            QDateTime t = v;
            setDigit(t, sectionIndex, steps > 0 ? min : max);
            bool mincmp = (t >= minimumDateTime);
            bool maxcmp = (t <= maximumDateTime);
            if (!mincmp || !maxcmp) {
                setDigit(t, sectionIndex, getDigit(steps > 0 ?
                                                   minimumDateTime :
                                                   maximumDateTime, sectionIndex));
                mincmp = (t >= minimumDateTime);
                maxcmp = (t <= maximumDateTime);
            }
            if (mincmp && maxcmp) {
                v = t;
            }
        } else {
            v = value.toDateTime();
        }
    }

    return bound(v, value, steps).toDateTime().toTimeZone(timeZone);
}